

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O1

bool wallet::IsBDBFile(path *path)

{
  pointer pcVar1;
  char cVar2;
  ulong uVar3;
  bool bVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  error_code ec;
  ifstream file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [31];
  uint32_t data;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = std::filesystem::status(&path->super_path);
  bVar4 = false;
  if ((cVar2 != '\0') && (bVar4 = false, cVar2 != -1)) {
    ec._M_value = 0;
    ec._M_cat = (error_category *)std::_V2::system_category();
    uVar3 = std::filesystem::file_size(&path->super_path,&ec);
    if (ec._M_value != 0) {
      (**(code **)(*(long *)ec._M_cat + 0x20))
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
      pcVar1 = (path->super_path)._M_pathname._M_dataplus._M_p;
      _data = (pointer)&local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&data,pcVar1,pcVar1 + (path->super_path)._M_pathname._M_string_length);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/db.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "IsBDBFile";
      logging_function._M_len = 9;
      LogPrintFormatInternal<char[10],std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x67,ALL,Info,(ConstevalFormatString<3U>)0x10f309b,
                 (char (*) [10])"IsBDBFile",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&data);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_data != &local_48) {
        operator_delete(_data,local_48._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_file != local_250) {
        operator_delete(_file,local_250[0]._M_allocated_capacity + 1);
      }
    }
    if (uVar3 < 0x1000) {
      bVar4 = false;
    }
    else {
      std::ifstream::ifstream(&file,(path->super_path)._M_pathname._M_dataplus._M_p,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        bVar4 = false;
      }
      else {
        std::istream::seekg((long)&file,0xc);
        _data = _data & 0xffffffff00000000;
        std::istream::read((char *)&file,(long)&data);
        bVar4 = data == 0x62310500 || data == 0x53162;
      }
      std::ifstream::~ifstream(&file);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBDBFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A Berkeley DB Btree file has at least 4K.
    // This check also prevents opening lock files.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 4096) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    file.seekg(12, std::ios::beg); // Magic bytes start at offset 12
    uint32_t data = 0;
    file.read((char*) &data, sizeof(data)); // Read 4 bytes of file to compare against magic

    // Berkeley DB Btree magic bytes, from:
    //  https://github.com/file/file/blob/5824af38469ec1ca9ac3ffd251e7afe9dc11e227/magic/Magdir/database#L74-L75
    //  - big endian systems - 00 05 31 62
    //  - little endian systems - 62 31 05 00
    return data == 0x00053162 || data == 0x62310500;
}